

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite_correlated_expressions.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::RewriteCorrelatedExpressions::VisitReplace
          (RewriteCorrelatedExpressions *this,BoundSubqueryExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  Binder *pBVar1;
  type binder;
  type subquery;
  RewriteCorrelatedRecursive rewrite;
  RewriteCorrelatedRecursive local_40;
  
  pBVar1 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)(expr_ptr + 0xb));
  if ((pBVar1->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pBVar1->correlated_columns).
      super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    RewriteCorrelatedRecursive::RewriteCorrelatedRecursive
              (&local_40,*(ColumnBinding *)&(expr->super_Expression).super_BaseExpression.type,
               (column_binding_map_t<idx_t> *)
               (expr->super_Expression).super_BaseExpression.alias._M_string_length);
    binder = shared_ptr<duckdb::Binder,_true>::operator*
                       ((shared_ptr<duckdb::Binder,_true> *)(expr_ptr + 0xb));
    subquery = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               ::operator*((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                            *)(expr_ptr + 0xd));
    RewriteCorrelatedRecursive::RewriteCorrelatedSubquery(&local_40,binder,subquery);
  }
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> RewriteCorrelatedExpressions::VisitReplace(BoundSubqueryExpression &expr,
                                                                  unique_ptr<Expression> *expr_ptr) {
	if (!expr.IsCorrelated()) {
		return nullptr;
	}
	// subquery detected within this subquery
	// recursively rewrite it using the RewriteCorrelatedRecursive class
	RewriteCorrelatedRecursive rewrite(base_binding, correlated_map);
	rewrite.RewriteCorrelatedSubquery(*expr.binder, *expr.subquery);
	return nullptr;
}